

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

int __thiscall Fl_Browser::item_width(Fl_Browser *this,void *item)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int *piVar6;
  bool bVar7;
  double dVar8;
  uint local_48;
  int done;
  Fl_Font font;
  int tsize;
  char *e;
  int *piStack_30;
  int ww;
  int *i;
  char *str;
  FL_BLINE *l;
  void *item_local;
  Fl_Browser *this_local;
  
  i = (int *)((long)item + 0x23);
  str = (char *)item;
  l = (FL_BLINE *)item;
  item_local = this;
  piStack_30 = column_widths(this);
  e._4_4_ = 0;
  for (; piVar6 = i, *piStack_30 != 0; piStack_30 = piStack_30 + 1) {
    cVar2 = column_char(this);
    pcVar4 = strchr((char *)piVar6,(int)cVar2);
    if (pcVar4 == (char *)0x0) break;
    i = (int *)(pcVar4 + 1);
    e._4_4_ = *piStack_30 + e._4_4_;
  }
  done = textsize(this);
  local_48 = Fl_Browser_::textfont(&this->super_Fl_Browser_);
  bVar1 = false;
  do {
    bVar7 = false;
    if (((char)*i == this->format_char_) && (bVar7 = false, *(char *)((long)i + 1) != '\0')) {
      bVar7 = *(char *)((long)i + 1) != this->format_char_;
    }
    if (!bVar7) break;
    piVar6 = (int *)((long)i + 2);
    switch(*(undefined1 *)((long)i + 1)) {
    case 0x2e:
      bVar1 = true;
      break;
    case 0x40:
      bVar1 = true;
      piVar6 = (int *)((long)i + 1);
      break;
    case 0x42:
    case 0x43:
      i = piVar6;
      while (iVar3 = isdigit((uint)(byte)*i), piVar6 = i, iVar3 != 0) {
        i = (int *)((long)i + 1);
      }
      break;
    case 0x46:
      i = piVar6;
      lVar5 = strtol((char *)piVar6,(char **)&i,10);
      local_48 = (uint)lVar5;
      piVar6 = i;
      break;
    case 0x4c:
    case 0x6c:
      done = 0x18;
      break;
    case 0x4d:
    case 0x6d:
      done = 0x12;
      break;
    case 0x53:
      i = piVar6;
      lVar5 = strtol((char *)piVar6,(char **)&i,10);
      done = (int)lVar5;
      piVar6 = i;
      break;
    case 0x62:
      local_48 = local_48 | 1;
      break;
    case 0x66:
    case 0x74:
      local_48 = 4;
      break;
    case 0x69:
      local_48 = local_48 | 2;
      break;
    case 0x73:
      done = 0xb;
    }
    i = piVar6;
  } while (!bVar1);
  if (((char)*i == this->format_char_) && (*(char *)((long)i + 1) != '\0')) {
    i = (int *)((long)i + 1);
  }
  if ((e._4_4_ == 0) && (*(long *)(str + 0x18) != 0)) {
    e._4_4_ = Fl_Image::w(*(Fl_Image **)(str + 0x18));
  }
  fl_font(local_48,done);
  dVar8 = fl_width((char *)i);
  return e._4_4_ + (int)dVar8 + 6;
}

Assistant:

int Fl_Browser::item_width(void *item) const {
  FL_BLINE* l=(FL_BLINE*)item;
  char* str = l->txt;
  const int* i = column_widths();
  int ww = 0;

  while (*i) { // add up all tab-separated fields
    char* e;
    e = strchr(str, column_char());
    if (!e) break; // last one occupied by text
    str = e+1;
    ww += *i++;
  }

  // OK, we gotta parse the string and find the string width...
  int tsize = textsize();
  Fl_Font font = textfont();
  int done = 0;

  while (*str == format_char_ && str[1] && str[1] != format_char_) {
    str ++;
    switch (*str++) {
    case 'l': case 'L': tsize = 24; break;
    case 'm': case 'M': tsize = 18; break;
    case 's': tsize = 11; break;
    case 'b': font = (Fl_Font)(font|FL_BOLD); break;
    case 'i': font = (Fl_Font)(font|FL_ITALIC); break;
    case 'f': case 't': font = FL_COURIER; break;
    case 'B':
    case 'C': while (isdigit(*str & 255)) str++; break; // skip a color number
    case 'F': font = (Fl_Font)strtol(str, &str, 10); break;
    case 'S': tsize = strtol(str, &str, 10); break;
    case '.':
      done = 1;
      break;
    case '@':
      str--;
      done = 1;
    }

    if (done)
      break;
  }

  if (*str == format_char_ && str[1])
    str ++;

  if (ww==0 && l->icon) ww = l->icon->w();

  fl_font(font, tsize);
  return ww + int(fl_width(str)) + 6;
}